

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMaterial(FBXConverter *this,Material *material,MeshGeometry *mesh)

{
  pointer ppaVar1;
  pointer ppaVar2;
  PropertyTable *props;
  MeshGeometry *mesh_00;
  bool bVar3;
  aiMaterial *this_00;
  mapped_type *pmVar4;
  aiMaterial *out_mat;
  PropertyTable *local_488;
  MeshGeometry *local_480;
  string name;
  aiShadingMode shadingMode;
  aiString str;
  
  local_480 = mesh;
  local_488 = Material::Props(material);
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  ppaVar1 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppaVar2 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  out_mat = this_00;
  str._0_8_ = material;
  pmVar4 = std::
           map<const_Assimp::FBX::Material_*,_unsigned_int,_std::less<const_Assimp::FBX::Material_*>,_std::allocator<std::pair<const_Assimp::FBX::Material_*const,_unsigned_int>_>_>
           ::operator[](&this->materials_converted,(key_type *)&str);
  *pmVar4 = (mapped_type)((ulong)((long)ppaVar1 - (long)ppaVar2) >> 3);
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&this->materials,&out_mat);
  str._0_8_ = str._0_8_ & 0xffffff0000000000;
  memset(str.data + 1,0x1b,0x3ff);
  std::__cxx11::string::string((string *)&name,(string *)&(material->super_Object).name);
  std::__cxx11::string::substr((ulong)&shadingMode,(ulong)&name);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &shadingMode,"Material::");
  std::__cxx11::string::~string((string *)&shadingMode);
  if (bVar3) {
    std::__cxx11::string::substr((ulong)&shadingMode,(ulong)&name);
    std::__cxx11::string::operator=((string *)&name,(string *)&shadingMode);
    std::__cxx11::string::~string((string *)&shadingMode);
  }
  mesh_00 = local_480;
  props = local_488;
  if (name._M_string_length != 0) {
    if (name._M_string_length < 0x400) {
      str.length = (ai_uint32)name._M_string_length;
      memcpy(str.data,name._M_dataplus._M_p,name._M_string_length);
      str.data[name._M_string_length] = '\0';
    }
    aiMaterial::AddProperty(out_mat,&str,"?mat.name",0,0);
  }
  bVar3 = std::operator==(&material->shading,"phong");
  if (bVar3) {
    shadingMode = aiShadingMode_Phong;
    aiMaterial::AddProperty<aiShadingMode>(out_mat,&shadingMode,1,"$mat.shadingm",0,0);
  }
  SetShadingPropertiesCommon(this,out_mat,props);
  SetShadingPropertiesRaw(this,out_mat,props,&material->textures,mesh_00);
  SetTextureProperties(this,out_mat,&material->textures,mesh_00);
  SetTextureProperties(this,out_mat,&material->layeredTextures,mesh_00);
  ppaVar1 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppaVar2 = (this->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::~string((string *)&name);
  return (int)((ulong)((long)ppaVar1 - (long)ppaVar2) >> 3) - 1;
}

Assistant:

unsigned int FBXConverter::ConvertMaterial(const Material& material, const MeshGeometry* const mesh)
        {
            const PropertyTable& props = material.Props();

            // generate empty output material
            aiMaterial* out_mat = new aiMaterial();
            materials_converted[&material] = static_cast<unsigned int>(materials.size());

            materials.push_back(out_mat);

            aiString str;

            // strip Material:: prefix
            std::string name = material.Name();
            if (name.substr(0, 10) == "Material::") {
                name = name.substr(10);
            }

            // set material name if not empty - this could happen
            // and there should be no key for it in this case.
            if (name.length()) {
                str.Set(name);
                out_mat->AddProperty(&str, AI_MATKEY_NAME);
            }

            // Set the shading mode as best we can: The FBX specification only mentions Lambert and Phong, and only Phong is mentioned in Assimp's aiShadingMode enum.
            if (material.GetShadingModel() == "phong")
            {
                aiShadingMode shadingMode = aiShadingMode_Phong;
                out_mat->AddProperty<aiShadingMode>(&shadingMode, 1, AI_MATKEY_SHADING_MODEL);               
            }

            // shading stuff and colors
            SetShadingPropertiesCommon(out_mat, props);
            SetShadingPropertiesRaw( out_mat, props, material.Textures(), mesh );

            // texture assignments
            SetTextureProperties(out_mat, material.Textures(), mesh);
            SetTextureProperties(out_mat, material.LayeredTextures(), mesh);

            return static_cast<unsigned int>(materials.size() - 1);
        }